

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
GGSock::Serialize::operator()
          (Serialize *this,
          map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
          *t,SerializationBuffer *buffer,size_t *offset)

{
  bool bVar1;
  bool bVar2;
  const_iterator obj;
  const_iterator buffer_00;
  reference offset_00;
  Serialize *in_RSI;
  SerializationBuffer *in_RDI;
  pair<const_int,_GGSock::FileServer::FileInfo> *p;
  const_iterator __end0;
  const_iterator __begin0;
  map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  *__range2;
  int32_t n;
  bool res;
  map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  *in_stack_ffffffffffffffa8;
  int32_t *in_stack_ffffffffffffffb8;
  _Self in_stack_ffffffffffffffc0;
  bool local_21;
  
  std::
  map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  ::size((map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
          *)0x144e91);
  local_21 = operator()((Serialize *)in_stack_ffffffffffffffc0._M_node,in_stack_ffffffffffffffb8,
                        in_RDI,(size_t *)in_stack_ffffffffffffffa8);
  obj = std::
        map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
        ::begin(in_stack_ffffffffffffffa8);
  buffer_00 = std::
              map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
              ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffc8,(_Self *)&stack0xffffffffffffffc0);
    if (!bVar1) break;
    offset_00 = std::_Rb_tree_const_iterator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>::
                operator*((_Rb_tree_const_iterator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>
                           *)0x144f14);
    bVar1 = operator()((Serialize *)buffer_00._M_node,&offset_00->first,in_RDI,
                       (size_t *)in_stack_ffffffffffffffa8);
    bVar2 = operator()(in_RSI,(FileInfo *)obj._M_node,(SerializationBuffer *)buffer_00._M_node,
                       (size_t *)offset_00);
    local_21 = (local_21 & bVar1) != 0 && bVar2;
    std::_Rb_tree_const_iterator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_GGSock::FileServer::FileInfo>_> *)
               in_RDI);
  }
  return local_21;
}

Assistant:

bool Serialize::operator()(const std::map<Key, Value> & t, SerializationBuffer & buffer, size_t & offset) {
    bool res = true;

    int32_t n = (int32_t) t.size();
    res &= operator()(n, buffer, offset);
    for (const auto & p : t) {
        res &= operator()(p.first, buffer, offset);
        res &= operator()(p.second, buffer, offset);
    }

    return res;
}